

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::SetRanges
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,int numSortedPairs,
          Char *sortedPairs)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if (0 < numSortedPairs * 2) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar4 = 0;
    do {
      if ((uVar4 != 0) && (sortedPairs[uVar4] <= sortedPairs[uVar4 - 1])) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x645,"(i == 0 || sortedPairs[i-1] < sortedPairs[i])",
                           "i == 0 || sortedPairs[i-1] < sortedPairs[i]");
        if (!bVar2) goto LAB_00e716e2;
        *puVar3 = 0;
      }
      if (sortedPairs[uVar4 + 1] < sortedPairs[uVar4]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x646,"(sortedPairs[i] <= sortedPairs[i+1])",
                           "sortedPairs[i] <= sortedPairs[i+1]");
        if (!bVar2) {
LAB_00e716e2:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      SetRange(this,allocator,sortedPairs[uVar4],sortedPairs[uVar4 + 1]);
      uVar4 = uVar4 + 2;
    } while (uVar4 < (uint)(numSortedPairs * 2));
  }
  return;
}

Assistant:

void CharSet<codepoint_t>::SetRanges(ArenaAllocator* allocator, int numSortedPairs, const Char* sortedPairs)
    {
        for (int i = 0; i < numSortedPairs * 2; i += 2)
        {
            Assert(i == 0 || sortedPairs[i-1] < sortedPairs[i]);
            Assert(sortedPairs[i] <= sortedPairs[i+1]);
            SetRange(allocator, sortedPairs[i], sortedPairs[i+1]);
        }
    }